

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O3

void idx2::BuildSubbands(v3i *N3,int NLevels,u64 TransformOrder,array<idx2::subband> *Subbands)

{
  uint uVar1;
  byte *pbVar2;
  u64 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  char cVar16;
  byte bVar17;
  grid *pgVar18;
  byte *pbVar19;
  int iVar20;
  ulong uVar21;
  grid *pgVar22;
  byte *pbVar23;
  char *__function;
  short sVar24;
  i8 iVar25;
  uint uVar26;
  char cVar27;
  ulong uVar28;
  ulong uVar29;
  dimension dVar30;
  long lVar31;
  short sVar32;
  long lVar33;
  bool bVar34;
  v3<signed_char> NextLevel3;
  v3<signed_char> MaxLevel3;
  v3<signed_char> NextLowHigh3;
  grid_split Gs;
  stack_array<idx2::grid,_32> Grids;
  circular_queue<idx2::subband,_256> Queue;
  u64 auStack_4f38 [361];
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 local_43ea;
  char local_43e8;
  char local_43e7 [3];
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 local_43e4;
  char local_43e2;
  int local_43e0;
  dimension local_43dc;
  u64 local_43d8;
  ulong local_43d0;
  subband local_43c8;
  array<idx2::subband> *local_4388;
  u64 local_4380;
  grid_split local_4378;
  subband local_4348 [12];
  undefined1 local_4040 [48];
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 aStack_4010;
  char acStack_400e [4];
  anon_union_2_4_6ba14846_for_v2<signed_char>_1 aStack_400a;
  char acStack_4008 [16336];
  undefined4 local_38;
  
  Subbands->Size = 0;
  local_43e0 = NLevels;
  GrowCapacity<idx2::subband>
            (Subbands,(long)(((NLevels <<
                              (1 < (N3->field_0).field_0.Z) +
                              (1 < (N3->field_0).field_0.Y) + (1 < (N3->field_0).field_0.X)) -
                             NLevels) + 1));
  lVar33 = 0;
  do {
    acStack_4008[lVar33 + 1] = '\0';
    *(undefined1 (*) [32])(local_4040 + lVar33) = ZEXT1632(ZEXT816(0) << 0x40);
    *(undefined1 (*) [32])(local_4040 + lVar33 + 0x10) = ZEXT1632(ZEXT816(0) << 0x40);
    lVar33 = lVar33 + 0x40;
  } while (lVar33 != 0x4000);
  acStack_4008[0x3fc8] = '\0';
  local_38 = 0;
  local_4348[0].Grid.super_extent.From = 0;
  local_4348[0].Grid.super_extent.Dims =
       (ulong)((N3->field_0).field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(N3->field_0).field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(N3->field_0).field_0.X & 0x1fffff;
  local_4348[0].Grid.Strd = 0x40000200001;
  local_4348[0].AccumGrid.super_extent.From = 0;
  local_4348[0].AccumGrid.Strd = 0x40000200001;
  local_4348[0]._48_8_ = 0;
  local_4348[0]._56_2_ = 0;
  local_4348[0].AccumGrid.super_extent.Dims = local_4348[0].Grid.super_extent.Dims;
  PushBack<idx2::subband,256>((circular_queue<idx2::subband,_256> *)local_4040,local_4348);
  local_43e7[0] = '\0';
  local_43e7[1] = '\0';
  local_43e7[2] = '\0';
  memset(local_4348,0,0x301);
  if (local_43e0 < 1) {
    uVar26 = local_38 & 0xffff;
    uVar28 = 0;
  }
  else {
    uVar28 = 0;
    local_43d8 = TransformOrder;
    local_4388 = Subbands;
    do {
      local_43dc = (dimension)TransformOrder & (Z|Y);
      uVar29 = TransformOrder >> 2;
      if (local_43dc == (Z|Y)) {
        sVar32 = (local_38._2_2_ - (short)local_38) + 0x100;
        if ((short)local_38 <= local_38._2_2_) {
          sVar32 = local_38._2_2_ - (short)local_38;
        }
        TransformOrder = local_43d8;
        if (uVar29 != 3) {
          TransformOrder = uVar29;
        }
        if (0 < (short)(sVar32 - 1U)) {
          uVar29 = (ulong)(ushort)(sVar32 - 1U);
          do {
            uVar26 = local_38 + (int)uVar29;
            lVar33 = Subbands->Size;
            if (Subbands->Capacity <= lVar33) {
              GrowCapacity<idx2::subband>(Subbands,0);
              lVar33 = Subbands->Size;
            }
            uVar21 = (ulong)((uVar26 & 0xff) << 6);
            Subbands->Size = lVar33 + 1;
            pbVar2 = (Subbands->Buffer).Data;
            uVar4 = *(undefined8 *)(local_4040 + uVar21);
            uVar5 = *(undefined8 *)(local_4040 + uVar21 + 8);
            uVar6 = *(undefined8 *)(local_4040 + uVar21 + 0x10);
            uVar7 = *(undefined8 *)(local_4040 + uVar21 + 0x18);
            uVar8 = *(undefined8 *)(local_4040 + uVar21 + 0x22);
            uVar9 = *(undefined8 *)(local_4040 + uVar21 + 0x2a);
            uVar10 = *(undefined8 *)(acStack_400e + uVar21);
            pbVar23 = pbVar2 + lVar33 * 0x40 + 0x1a;
            *(undefined8 *)pbVar23 = *(undefined8 *)(local_4040 + uVar21 + 0x1a);
            *(undefined8 *)(pbVar23 + 8) = uVar8;
            *(undefined8 *)(pbVar23 + 0x10) = uVar9;
            *(undefined8 *)(pbVar23 + 0x18) = uVar10;
            pbVar2 = pbVar2 + lVar33 * 0x40;
            *(undefined8 *)pbVar2 = uVar4;
            *(undefined8 *)(pbVar2 + 8) = uVar5;
            *(undefined8 *)(pbVar2 + 0x10) = uVar6;
            *(undefined8 *)(pbVar2 + 0x18) = uVar7;
            PopBack<idx2::subband,256>
                      (&local_43c8,(idx2 *)local_4040,(circular_queue<idx2::subband,_256> *)0x1,
                       (i16)(local_4040 + uVar21));
            bVar34 = 1 < (long)uVar29;
            uVar29 = uVar29 - 1;
          } while (bVar34);
        }
        cVar27 = (char)uVar28 + '\x01';
        if ('\x1f' < cVar27) goto LAB_0018eff0;
        uVar29 = (ulong)((local_38 & 0xff) << 6);
        (&local_4348[0].Grid)[cVar27].Strd = *(u64 *)(local_4040 + uVar29 + 0x10);
        (&local_4348[0].Grid)[cVar27].super_extent = *(extent *)(local_4040 + uVar29);
        local_43d8 = TransformOrder;
        uVar28 = CONCAT71((int7)(uVar28 >> 8),cVar27);
        uVar26 = local_38;
      }
      else {
        uVar26 = local_38 & 0xffff;
        sVar32 = (local_38._2_2_ - (short)local_38) + 0x100;
        if ((short)local_38 <= local_38._2_2_) {
          sVar32 = local_38._2_2_ - (short)local_38;
        }
        dVar30 = (dimension)TransformOrder & (Z|Y);
        local_43e7[dVar30] = local_43e7[dVar30] + '\x01';
        TransformOrder = uVar29;
        if (0 < sVar32) {
          uVar26 = local_38 & 0xff;
          local_43d0 = uVar28;
          local_4380 = uVar29;
          do {
            SplitAlternate(&local_4378,(grid *)(local_4040 + (uVar26 << 6)),local_43dc);
            lVar33 = (ulong)(byte)local_38 * 0x40;
            local_43ea = *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)
                          (acStack_400e + lVar33 + -2);
            local_43e8 = acStack_400e[lVar33];
            local_43ea.E[dVar30] = local_43ea.E[dVar30] + '\x01';
            local_43e2 = acStack_4008[lVar33];
            local_43e4 = *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)
                          (acStack_4008 + lVar33 + -2);
            local_43e4.E[dVar30] = '\x01';
            local_43c8.Grid.Strd = local_4378.First.Strd;
            local_43c8.Grid.super_extent.From = local_4378.First.super_extent.From;
            local_43c8.Grid.super_extent.Dims = local_4378.First.super_extent.Dims;
            local_43c8.AccumGrid.Strd._0_2_ = (undefined2)local_4378.First.Strd;
            local_43c8.AccumGrid.Strd._2_6_ = (undefined6)(local_4378.First.Strd >> 0x10);
            local_43c8.AccumGrid.super_extent.From._0_2_ =
                 (undefined2)local_4378.First.super_extent.From;
            local_43c8.AccumGrid.super_extent.From._2_6_ =
                 (undefined6)(local_4378.First.super_extent.From >> 0x10);
            local_43c8.AccumGrid.super_extent.Dims._0_2_ =
                 (undefined2)local_4378.First.super_extent.Dims;
            local_43c8.AccumGrid.super_extent.Dims._2_6_ =
                 (undefined6)(local_4378.First.super_extent.Dims >> 0x10);
            local_43c8.Level3.field_0.field_0.Z = local_43e8;
            local_43c8.Level3.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)(v2<signed_char>)local_43ea;
            local_43c8.Level3Rev.field_0.field_0.Z = local_43e8;
            local_43c8.Level3Rev.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)(v2<signed_char>)local_43ea;
            local_43c8.LowHigh3.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)
                 (v2<signed_char>)
                 *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)(acStack_4008 + lVar33 + -2);
            local_43c8.LowHigh3.field_0.field_0.Z = acStack_4008[lVar33];
            iVar25 = (i8)local_43d0;
            local_43c8.Level = iVar25;
            PushBack<idx2::subband,256>
                      ((circular_queue<idx2::subband,_256> *)local_4040,&local_43c8);
            local_43c8.Grid.Strd = local_4378.Second.Strd;
            local_43c8.Grid.super_extent.From = local_4378.Second.super_extent.From;
            local_43c8.Grid.super_extent.Dims = local_4378.Second.super_extent.Dims;
            local_43c8.AccumGrid.Strd._0_2_ = (undefined2)local_4378.Second.Strd;
            local_43c8.AccumGrid.Strd._2_6_ = (undefined6)(local_4378.Second.Strd >> 0x10);
            local_43c8.AccumGrid.super_extent.From._0_2_ =
                 (undefined2)local_4378.Second.super_extent.From;
            local_43c8.AccumGrid.super_extent.From._2_6_ =
                 (undefined6)(local_4378.Second.super_extent.From >> 0x10);
            local_43c8.AccumGrid.super_extent.Dims._0_2_ =
                 (undefined2)local_4378.Second.super_extent.Dims;
            local_43c8.AccumGrid.super_extent.Dims._2_6_ =
                 (undefined6)(local_4378.Second.super_extent.Dims >> 0x10);
            lVar33 = (ulong)(byte)local_38 * 0x40;
            local_43c8.Level3.field_0.field_0.Z = acStack_400e[lVar33];
            local_43c8.Level3.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)
                 (v2<signed_char>)
                 *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)(acStack_400e + lVar33 + -2);
            local_43c8.Level3Rev.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)
                 (v2<signed_char>)
                 *(anon_union_2_4_6ba14846_for_v2<signed_char>_1 *)(acStack_400e + lVar33 + -2);
            local_43c8.Level3Rev.field_0.field_0.Z = acStack_400e[lVar33];
            local_43c8.LowHigh3.field_0.field_3.XY.field_0 =
                 (v2<signed_char>)(v2<signed_char>)local_43e4;
            local_43c8.LowHigh3.field_0.field_0.Z = local_43e2;
            local_43c8.Level = iVar25;
            PushBack<idx2::subband,256>
                      ((circular_queue<idx2::subband,_256> *)local_4040,&local_43c8);
            iVar20 = (int)(short)local_38;
            uVar1 = iVar20 + 1;
            uVar26 = uVar1 & 0xff;
            local_38 = CONCAT22(local_38._2_2_,(ushort)(byte)uVar1);
            if (0xff < iVar20) {
              __function = 
              "t &idx2::stack_array<idx2::subband, 256>::operator[](int) const [t = idx2::subband, N = 256]"
              ;
              goto LAB_0018efe3;
            }
            sVar32 = sVar32 + -1;
            Subbands = local_4388;
            uVar28 = local_43d0;
            TransformOrder = local_4380;
          } while (sVar32 != 0);
        }
      }
    } while ((char)uVar28 < local_43e0);
  }
  sVar24 = local_38._2_2_ - (short)uVar26;
  sVar32 = sVar24 + 0x100;
  if ((short)uVar26 <= local_38._2_2_) {
    sVar32 = sVar24;
  }
  if (0 < sVar32) {
    uVar29 = (ulong)((uVar26 & 0xff) << 6);
    lVar33 = Subbands->Size;
    if (Subbands->Capacity <= lVar33) {
      GrowCapacity<idx2::subband>(Subbands,0);
      lVar33 = Subbands->Size;
    }
    Subbands->Size = lVar33 + 1;
    pbVar2 = (Subbands->Buffer).Data;
    uVar4 = *(undefined8 *)(local_4040 + uVar29);
    uVar5 = *(undefined8 *)(local_4040 + uVar29 + 8);
    uVar6 = *(undefined8 *)(local_4040 + uVar29 + 0x10);
    uVar7 = *(undefined8 *)(local_4040 + uVar29 + 0x18);
    uVar8 = *(undefined8 *)(local_4040 + uVar29 + 0x22);
    uVar9 = *(undefined8 *)(local_4040 + uVar29 + 0x2a);
    uVar10 = *(undefined8 *)(acStack_400e + uVar29);
    pbVar23 = pbVar2 + lVar33 * 0x40 + 0x1a;
    *(undefined8 *)pbVar23 = *(undefined8 *)(local_4040 + uVar29 + 0x1a);
    *(undefined8 *)(pbVar23 + 8) = uVar8;
    *(undefined8 *)(pbVar23 + 0x10) = uVar9;
    *(undefined8 *)(pbVar23 + 0x18) = uVar10;
    pbVar2 = pbVar2 + lVar33 * 0x40;
    *(undefined8 *)pbVar2 = uVar4;
    *(undefined8 *)(pbVar2 + 8) = uVar5;
    *(undefined8 *)(pbVar2 + 0x10) = uVar6;
    *(undefined8 *)(pbVar2 + 0x18) = uVar7;
  }
  cVar27 = local_43e7[2];
  if ('\0' < (char)uVar28) {
    pgVar18 = &local_4348[0].Grid + (uVar28 & 0xff);
    pgVar22 = &local_4348[0].AccumGrid;
    do {
      local_43c8.Grid.Strd = (((subband *)(pgVar22 + -1))->Grid).Strd;
      local_43c8.Grid.super_extent.From = (((subband *)(pgVar22 + -1))->Grid).super_extent.From;
      local_43c8.Grid.super_extent.Dims = (((subband *)(pgVar22 + -1))->Grid).super_extent.Dims;
      (((subband *)(pgVar22 + -1))->Grid).Strd = pgVar18->Strd;
      uVar3 = (pgVar18->super_extent).Dims;
      (((subband *)(pgVar22 + -1))->Grid).super_extent.From = (pgVar18->super_extent).From;
      (((subband *)(pgVar22 + -1))->Grid).super_extent.Dims = uVar3;
      pgVar18->Strd = local_43c8.Grid.Strd;
      (pgVar18->super_extent).From = local_43c8.Grid.super_extent.From;
      (pgVar18->super_extent).Dims = local_43c8.Grid.super_extent.Dims;
      pgVar18 = pgVar18 + -1;
      bVar34 = pgVar22 < pgVar18;
      pgVar22 = pgVar22 + 1;
    } while (bVar34);
  }
  lVar33 = Subbands->Size;
  if (0 < lVar33) {
    local_43dc = CONCAT31(local_43dc._1_3_,local_43e7[0]);
    cVar16 = local_43e7[1];
    lVar31 = 0;
    do {
      pbVar2 = (Subbands->Buffer).Data;
      pbVar2[lVar31 + 0x32] = cVar27 - pbVar2[lVar31 + 0x35];
      *(ushort *)(pbVar2 + lVar31 + 0x30) =
           CONCAT11(cVar16 - pbVar2[lVar31 + 0x34],(undefined1)local_43dc - pbVar2[lVar31 + 0x33]);
      bVar17 = ~pbVar2[lVar31 + 0x39] + (char)local_43e0;
      pbVar2[lVar31 + 0x39] = bVar17;
      if ('\x1f' < (char)bVar17) {
LAB_0018eff0:
        __function = 
        "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]";
LAB_0018efe3:
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,__function);
      }
      MergeSubbandGrids(&local_43c8.Grid,&local_4348[0].Grid + (char)bVar17,
                        (grid *)(pbVar2 + lVar31));
      *(u64 *)(pbVar2 + lVar31 + 0x28) = local_43c8.Grid.Strd;
      *(u64 *)(pbVar2 + lVar31 + 0x18) = local_43c8.Grid.super_extent.From;
      *(u64 *)((long)(pbVar2 + lVar31 + 0x18) + 8) = local_43c8.Grid.super_extent.Dims;
      lVar31 = lVar31 + 0x40;
      lVar33 = lVar33 + -1;
    } while (lVar33 != 0);
    lVar33 = Subbands->Size;
  }
  pbVar2 = (Subbands->Buffer).Data;
  pbVar23 = pbVar2 + (lVar33 * 8 + -8) * 8;
  if (pbVar2 < pbVar23) {
    do {
      pbVar19 = pbVar2 + 0x40;
      uVar4 = *(undefined8 *)pbVar2;
      uVar5 = *(undefined8 *)(pbVar2 + 8);
      uVar6 = *(undefined8 *)(pbVar2 + 0x10);
      uVar7 = *(undefined8 *)(pbVar2 + 0x18);
      uVar8 = *(undefined8 *)(pbVar2 + 0x30);
      local_43c8.AccumGrid.super_extent.Dims._0_2_ = (undefined2)*(undefined8 *)(pbVar2 + 0x20);
      local_43c8.AccumGrid.super_extent.Dims._2_6_ =
           (undefined6)((ulong)*(undefined8 *)(pbVar2 + 0x20) >> 0x10);
      local_43c8.AccumGrid.Strd._0_2_ = (undefined2)*(undefined8 *)(pbVar2 + 0x28);
      local_43c8.AccumGrid.Strd._2_6_ = (undefined6)((ulong)*(undefined8 *)(pbVar2 + 0x28) >> 0x10);
      local_43c8.Level3.field_0.field_3.XY.field_0 = SUB82(uVar8,0);
      local_43c8.LowHigh3.field_0.field_0.Z = (char)*(undefined8 *)(pbVar2 + 0x38);
      local_43c8.Level = (i8)((ulong)*(undefined8 *)(pbVar2 + 0x38) >> 8);
      local_43c8.AccumGrid.super_extent.From._2_6_ = (undefined6)((ulong)uVar7 >> 0x10);
      uVar9 = *(undefined8 *)pbVar23;
      uVar10 = *(undefined8 *)(pbVar23 + 8);
      uVar11 = *(undefined8 *)(pbVar23 + 0x10);
      uVar12 = *(undefined8 *)(pbVar23 + 0x18);
      uVar13 = *(undefined8 *)(pbVar23 + 0x22);
      uVar14 = *(undefined8 *)(pbVar23 + 0x2a);
      uVar15 = *(undefined8 *)(pbVar23 + 0x32);
      *(undefined8 *)(pbVar2 + 0x1a) = *(undefined8 *)(pbVar23 + 0x1a);
      *(undefined8 *)(pbVar2 + 0x22) = uVar13;
      *(undefined8 *)(pbVar2 + 0x2a) = uVar14;
      *(undefined8 *)(pbVar2 + 0x32) = uVar15;
      *(undefined8 *)pbVar2 = uVar9;
      *(undefined8 *)(pbVar2 + 8) = uVar10;
      *(undefined8 *)(pbVar2 + 0x10) = uVar11;
      *(undefined8 *)(pbVar2 + 0x18) = uVar12;
      *(undefined8 *)pbVar23 = uVar4;
      *(undefined8 *)(pbVar23 + 8) = uVar5;
      *(undefined8 *)(pbVar23 + 0x10) = uVar6;
      *(undefined8 *)(pbVar23 + 0x18) = uVar7;
      *(ulong *)(pbVar23 + 0x1a) =
           CONCAT26((undefined2)local_43c8.AccumGrid.super_extent.Dims,
                    local_43c8.AccumGrid.super_extent.From._2_6_);
      *(ulong *)(pbVar23 + 0x22) =
           CONCAT26((undefined2)local_43c8.AccumGrid.Strd,
                    local_43c8.AccumGrid.super_extent.Dims._2_6_);
      *(ulong *)(pbVar23 + 0x2a) =
           CONCAT26(local_43c8.Level3.field_0.field_3.XY.field_0,local_43c8.AccumGrid.Strd._2_6_);
      *(ulong *)(pbVar23 + 0x32) =
           CONCAT17(local_43c8.Level,
                    CONCAT16(local_43c8.LowHigh3.field_0.field_0.Z,(int6)((ulong)uVar8 >> 0x10)));
      pbVar23 = pbVar23 + -0x40;
      pbVar2 = pbVar19;
    } while (pbVar19 < pbVar23);
  }
  return;
}

Assistant:

void
BuildSubbands(const v3i& N3, int NLevels, u64 TransformOrder, array<subband>* Subbands)
{
  Clear(Subbands);
  Reserve(Subbands, ((1 << NumDims(N3)) - 1) * NLevels + 1);
  circular_queue<subband, 256> Queue;
  PushBack(&Queue, subband{ grid(N3), grid(N3), v3<i8>(0), v3<i8>(0), v3<i8>(0), i8(0) });
  i8 Level = 0;
  u64 PrevOrder = TransformOrder;
  v3<i8> MaxLevel3(0);
  stack_array<grid, 32> Grids;
  while (Level < NLevels)
  {
    idx2_Assert(TransformOrder != 0);
    int D = TransformOrder & 0x3;
    TransformOrder >>= 2;
    if (D == 3)
    {                          // next level
      if (TransformOrder == 3) // next one is the last +
        TransformOrder = PrevOrder;
      else
        PrevOrder = TransformOrder;
      i16 Sz = Size(Queue);
      for (i16 I = Sz - 1; I >= 1; --I)
      {
        PushBack(Subbands, Queue[I]);
        PopBack(&Queue);
      }
      ++Level;
      Grids[Level] = Queue[0].Grid;
    }
    else
    {
      ++MaxLevel3[D];
      i16 Sz = Size(Queue);
      for (i16 I = 0; I < Sz; ++I)
      {
        const grid& G = Queue[0].Grid;
        grid_split Gs = SplitAlternate(G, dimension(D));
        v3<i8> NextLevel3 = Queue[0].Level3;
        ++NextLevel3[D];
        v3<i8> NextLowHigh3 = Queue[0].LowHigh3;
        idx2_Assert(NextLowHigh3[D] == 0);
        NextLowHigh3[D] = 1;
        PushBack(&Queue,
                 subband{ Gs.First, Gs.First, NextLevel3, NextLevel3, Queue[0].LowHigh3, Level });
        PushBack(
          &Queue,
          subband{ Gs.Second, Gs.Second, Queue[0].Level3, Queue[0].Level3, NextLowHigh3, Level });
        PopFront(&Queue);
      }
    }
  }
  if (Size(Queue) > 0)
    PushBack(Subbands, Queue[0]);
  Reverse(Begin(Grids), Begin(Grids) + Level + 1);
  i64 Sz = Size(*Subbands);
  for (i64 I = 0; I < Sz; ++I)
  {
    subband& Sband = (*Subbands)[I];
    Sband.Level3 = MaxLevel3 - Sband.Level3Rev;
    Sband.Level = i8(NLevels - Sband.Level - 1);
    Sband.AccumGrid = MergeSubbandGrids(Grids[Sband.Level], Sband.Grid);
  }
  Reverse(Begin(*Subbands), End(*Subbands));
}